

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O2

OptionalStorage<llbuild::buildsystem::BuildValue,_false> * __thiscall
llvm::optional_detail::OptionalStorage<llbuild::buildsystem::BuildValue,_false>::operator=
          (OptionalStorage<llbuild::buildsystem::BuildValue,_false> *this,
          OptionalStorage<llbuild::buildsystem::BuildValue,_false> *O)

{
  BuildValue *y;
  
  if (O->hasVal == false) {
    reset(this);
  }
  else {
    y = getPointer(O);
    operator=(this,y);
  }
  return this;
}

Assistant:

OptionalStorage &operator=(OptionalStorage &&O) {
    if (!O.hasVal)
      reset();
    else {
      *this = std::move(*O.getPointer());
    }
    return *this;
  }